

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinDeserializer<std::unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>,_void>
     ::deserialize<InputStream>
               (unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
                *opt,InputStream *istream)

{
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *pvVar1;
  uint8_t discriminator;
  uint32_t size;
  char local_1d;
  undefined4 local_1c;
  
  std::istream::read((char *)istream->stream,(long)&local_1d);
  if (local_1d == '\0') {
    pvVar1 = (opt->_M_t).
             super___uniq_ptr_impl<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_*,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
             .
             super__Head_base<0UL,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_*,_false>
             ._M_head_impl;
    (opt->_M_t).
    super___uniq_ptr_impl<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_*,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
    .super__Head_base<0UL,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_*,_false>
    ._M_head_impl = (vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *)0x0;
    if (pvVar1 != (vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *)0x0) {
      std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>::
      operator()((default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *
                 )opt,pvVar1);
    }
  }
  else {
    BuiltinDeserializer<std::unique_ptr<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>,std::default_delete<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>>,void>
    ::
    make_nonempty<std::unique_ptr<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>,std::default_delete<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>>>
              (opt);
    pvVar1 = (opt->_M_t).
             super___uniq_ptr_impl<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_*,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
             .
             super__Head_base<0UL,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_*,_false>
             ._M_head_impl;
    std::istream::read((char *)istream->stream,(long)&local_1c);
    BuiltinDeserializer<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_void>::
    deserialize_elems<InputStream>(pvVar1,local_1c,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }